

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O1

int testValid_Pipeline(void)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  bool bVar4;
  Pipeline *pPVar5;
  Type *m;
  Type *m_00;
  Type *m_01;
  Type *m_02;
  NeuralNetwork *nn;
  ostream *poVar6;
  NetworkUpdateParameters *this;
  Type *this_00;
  CategoricalCrossEntropyLossLayer *pCVar7;
  ModelDescription *this_01;
  Type *pTVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  uint uVar11;
  RepeatedPtrField<CoreML::Specification::Model> *this_02;
  Result res;
  string targetName;
  string softmaxOutputName;
  TensorAttributes tensorAttributesD;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesB;
  TensorAttributes tensorAttributesA;
  Model spec;
  undefined1 local_1c8 [8];
  _Alloc_hider local_1c0;
  undefined1 local_1b8 [24];
  pointer local_1a0;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  string local_178;
  string local_158;
  TensorAttributes local_138;
  TensorAttributes local_128;
  TensorAttributes local_118;
  TensorAttributes local_108;
  Model local_f8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_68;
  
  CoreML::Specification::Model::Model(&local_f8);
  CoreML::Result::Result((Result *)&local_1a0);
  local_108.name = "A";
  local_108.dimension = 3;
  local_108._12_4_ = 0;
  local_118.name = "B";
  local_118.dimension = 1;
  local_118._12_4_ = 0;
  local_128.name = "C";
  local_128.dimension = 1;
  local_128._12_4_ = 0;
  local_138.name = "D";
  local_138.dimension = 3;
  local_138._12_4_ = 0;
  pPVar5 = buildEmptyPipelineModelWithStringOutput(&local_f8,true,&local_108,"E");
  local_f8.specificationversion_ = 4;
  this_02 = &pPVar5->models_;
  m = google::protobuf::internal::RepeatedPtrFieldBase::
      Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                (&this_02->super_RepeatedPtrFieldBase,(Type *)0x0);
  m_00 = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                   (&this_02->super_RepeatedPtrFieldBase,(Type *)0x0);
  m_01 = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                   (&this_02->super_RepeatedPtrFieldBase,(Type *)0x0);
  m_02 = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                   (&this_02->super_RepeatedPtrFieldBase,(Type *)0x0);
  buildBasicNeuralNetworkModel(m,false,&local_108,&local_118,1,false,false);
  buildBasicNeuralNetworkModel(m_00,false,&local_118,&local_128,1,false,false);
  nn = buildBasicNeuralNetworkModel(m_01,true,&local_128,&local_138,1,false,false);
  buildBasicNearestNeighborClassifier(m_02,false,&local_138,"E");
  CoreML::Model::validate((Result *)local_1c8,m);
  local_1a0 = (pointer)local_1c8;
  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
  pcVar1 = local_1b8 + 8;
  if (local_1c0._M_p != pcVar1) {
    operator_delete(local_1c0._M_p,local_1b8._8_8_ + 1);
  }
  bVar4 = CoreML::Result::good((Result *)&local_1a0);
  if (bVar4) {
    CoreML::Model::validate((Result *)local_1c8,m_00);
    local_1a0 = (pointer)local_1c8;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
    if (local_1c0._M_p != pcVar1) {
      operator_delete(local_1c0._M_p,local_1b8._8_8_ + 1);
    }
    bVar4 = CoreML::Result::good((Result *)&local_1a0);
    if (bVar4) {
      CoreML::Model::validate((Result *)local_1c8,m_01);
      local_1a0 = (pointer)local_1c8;
      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
      if (local_1c0._M_p != pcVar1) {
        operator_delete(local_1c0._M_p,local_1b8._8_8_ + 1);
      }
      bVar4 = CoreML::Result::good((Result *)&local_1a0);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                   ,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x987);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!((res).good())",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      }
      else {
        CoreML::Model::validate((Result *)local_1c8,m_02);
        local_1a0 = (pointer)local_1c8;
        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
        if (local_1c0._M_p != pcVar1) {
          operator_delete(local_1c0._M_p,local_1b8._8_8_ + 1);
        }
        bVar4 = CoreML::Result::good((Result *)&local_1a0);
        if (bVar4) {
          CoreML::Model::validate((Result *)local_1c8,&local_f8);
          local_1a0 = (pointer)local_1c8;
          std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
          if (local_1c0._M_p != pcVar1) {
            operator_delete(local_1c0._M_p,local_1b8._8_8_ + 1);
          }
          bVar4 = CoreML::Result::good((Result *)&local_1a0);
          if (!bVar4) {
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"softmax_out","");
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"cce_target","");
            addSoftmaxLayer(m_01,"softmax",local_138.name,local_158._M_dataplus._M_p);
            if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
              this = (NetworkUpdateParameters *)operator_new(0x50);
              CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
              nn->updateparams_ = this;
            }
            this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                                (&(nn->updateparams_->losslayers_).super_RepeatedPtrFieldBase,
                                 (Type *)0x0);
            local_1c8 = (undefined1  [8])local_1b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"cce_loss","");
            google::protobuf::internal::ArenaStringPtr::SetNoArena
                      (&this_00->name_,
                       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                       (string *)local_1c8);
            if (local_1c8 != (undefined1  [8])local_1b8) {
              operator_delete((void *)local_1c8,local_1b8._0_8_ + 1);
            }
            if (this_00->_oneof_case_[0] != 10) {
              CoreML::Specification::LossLayer::clear_LossLayerType(this_00);
              this_00->_oneof_case_[0] = 10;
              pCVar7 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
              CoreML::Specification::CategoricalCrossEntropyLossLayer::
              CategoricalCrossEntropyLossLayer(pCVar7);
              (this_00->LossLayerType_).categoricalcrossentropylosslayer_ = pCVar7;
            }
            pCVar7 = (this_00->LossLayerType_).categoricalcrossentropylosslayer_;
            psVar3 = (pCVar7->input_).ptr_;
            if (psVar3 == (string *)
                          &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                        (&pCVar7->input_,&local_158);
            }
            else {
              std::__cxx11::string::_M_assign((string *)psVar3);
            }
            psVar3 = (pCVar7->target_).ptr_;
            if (psVar3 == (string *)
                          &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                        (&pCVar7->target_,&local_178);
            }
            else {
              std::__cxx11::string::_M_assign((string *)psVar3);
            }
            if (m_01->description_ == (ModelDescription *)0x0) {
              this_01 = (ModelDescription *)operator_new(0x78);
              CoreML::Specification::ModelDescription::ModelDescription(this_01);
              m_01->description_ = this_01;
            }
            pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                               (&(m_01->description_->traininginput_).super_RepeatedPtrFieldBase,
                                (Type *)0x0);
            psVar3 = (pTVar8->name_).ptr_;
            if (psVar3 == (string *)
                          &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                        (&pTVar8->name_,&local_178);
            }
            else {
              std::__cxx11::string::_M_assign((string *)psVar3);
            }
            if (pTVar8->type_ == (FeatureType *)0x0) {
              pFVar9 = (FeatureType *)operator_new(0x28);
              CoreML::Specification::FeatureType::FeatureType(pFVar9);
              pTVar8->type_ = pFVar9;
            }
            pFVar9 = pTVar8->type_;
            if (pFVar9->_oneof_case_[0] != 5) {
              CoreML::Specification::FeatureType::clear_Type(pFVar9);
              pFVar9->_oneof_case_[0] = 5;
              pAVar10 = (ArrayFeatureType *)operator_new(0x48);
              CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
              (pFVar9->Type_).multiarraytype_ = pAVar10;
            }
            pAVar10 = (pFVar9->Type_).multiarraytype_;
            pAVar10->datatype_ = 0x20020;
            iVar2 = (pAVar10->shape_).total_size_;
            if ((pAVar10->shape_).current_size_ == iVar2) {
              google::protobuf::RepeatedField<long>::Reserve(&pAVar10->shape_,iVar2 + 1);
            }
            iVar2 = (pAVar10->shape_).current_size_;
            (pAVar10->shape_).current_size_ = iVar2 + 1;
            ((pAVar10->shape_).rep_)->elements[iVar2] = 1;
            addLearningRate<CoreML::Specification::NeuralNetwork>
                      (nn,kSgdOptimizer,0.699999988079071,0.0,1.0);
            local_68._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_68._M_impl.super__Rb_tree_header._M_header;
            local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_68._M_impl._0_8_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_68._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_68._M_impl.super__Rb_tree_header._M_header._M_left;
            addMiniBatchSize<CoreML::Specification::NeuralNetwork>
                      (nn,kSgdOptimizer,10,5,100,
                       (set<long,_std::less<long>,_std::allocator<long>_> *)&local_68);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_68);
            local_98._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_98._M_impl.super__Rb_tree_header._M_header;
            local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_98._M_impl._0_8_ = 0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_98._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_98._M_impl.super__Rb_tree_header._M_header._M_left;
            addEpochs<CoreML::Specification::NeuralNetwork>
                      (nn,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_98);
            local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_c8._M_impl.super__Rb_tree_header._M_header;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_c8._M_impl._0_8_ = 0;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
            addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
                      (nn,0x7e3,0,0x7e3,
                       (set<long,_std::less<long>,_std::allocator<long>_> *)&local_c8);
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_c8);
            CoreML::Model::validate((Result *)local_1c8,m_01);
            local_1a0 = (pointer)local_1c8;
            std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
            if (local_1c0._M_p != pcVar1) {
              operator_delete(local_1c0._M_p,local_1b8._8_8_ + 1);
            }
            bVar4 = CoreML::Result::good((Result *)&local_1a0);
            if (!bVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                         ,0x7c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x9a9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(res).good()",0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6," was false, expected true.",0x1a);
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            uVar11 = (uint)!bVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_001c3d98;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                     ,0x7c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x98e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!((res).good())",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                     ,0x7c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x98a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(res).good()",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x984);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x981);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  std::ostream::put((char)poVar6);
  uVar11 = 1;
  std::ostream::flush();
LAB_001c3d98:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != &local_188) {
    operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_f8);
  return uVar11;
}

Assistant:

int testValid_Pipeline() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline = buildEmptyPipelineModelWithStringOutput(spec, true, &tensorAttributesA, "E");
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto m1 = pipeline->add_models();
    auto m2 = pipeline->add_models();
    auto m3 = pipeline->add_models();
    auto m4 = pipeline->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    (void)buildBasicNeuralNetworkModel(*m2, false, &tensorAttributesB, &tensorAttributesC);
    auto neuralNet = buildBasicNeuralNetworkModel(*m3, true, &tensorAttributesC, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m4, false, &tensorAttributesD, "E");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m3);
    ML_ASSERT_BAD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    // expect validation to pass!
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Add target to updatable neural network model (3rd) within pipeline
    std::string softmaxOutputName = "softmax_out";
    std::string targetName = "cce_target";
    (void)addSoftmaxLayer(*m3, "softmax", tensorAttributesD.name, softmaxOutputName.c_str());

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cce_loss");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxOutputName);
    ceLossLayer->set_target(targetName);

    auto trainingInput = (*m3).mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    return 0;
}